

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

void cm::anon_unknown_0::write_req_cb(uv_write_t *req,int status)

{
  bool bVar1;
  element_type *this;
  undefined1 local_30 [8];
  shared_ptr<std::function<void_(int)>_> cb;
  unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
  self;
  int status_local;
  uv_write_t *req_local;
  
  std::
  unique_ptr<cm::(anonymous_namespace)::write_req,std::default_delete<cm::(anonymous_namespace)::write_req>>
  ::unique_ptr<std::default_delete<cm::(anonymous_namespace)::write_req>,void>
            ((unique_ptr<cm::(anonymous_namespace)::write_req,std::default_delete<cm::(anonymous_namespace)::write_req>>
              *)&cb.super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(pointer)req);
  std::
  unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
  ::operator->((unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
                *)&cb.super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
  std::weak_ptr<std::function<void_(int)>_>::lock((weak_ptr<std::function<void_(int)>_> *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    this = std::
           __shared_ptr_access<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_30);
    std::function<void_(int)>::operator()(this,status);
  }
  std::shared_ptr<std::function<void_(int)>_>::~shared_ptr
            ((shared_ptr<std::function<void_(int)>_> *)local_30);
  std::
  unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
  ::~unique_ptr((unique_ptr<cm::(anonymous_namespace)::write_req,_std::default_delete<cm::(anonymous_namespace)::write_req>_>
                 *)&cb.super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  return;
}

Assistant:

void write_req_cb(uv_write_t* req, int status)
{
  // Ownership has been transferred from the event loop.
  std::unique_ptr<write_req> self(static_cast<write_req*>(req));

  // Notify the original uv_write caller if it is still interested.
  if (auto cb = self->cb_.lock()) {
    (*cb)(status);
  }
}